

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O2

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMainMethod *stm)

{
  element_type *peVar1;
  CFieldList *pCVar2;
  CCompoundStm *pCVar3;
  __shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  allocator local_49;
  undefined1 local_48 [40];
  
  std::operator<<((ostream *)&std::cout,"typechecker: mainmethod\n");
  peVar1 = (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string((string *)local_48,"main",&local_49);
  p_Var4 = &std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&peVar1->methods,(key_type *)local_48)->
            super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->currentMethod).super___shared_ptr<MethodInfo,_(__gnu_cxx::_Lock_policy)2>,
             p_Var4);
  std::__cxx11::string::~string((string *)local_48);
  pCVar2 = (stm->vars)._M_t.super___uniq_ptr_impl<CFieldList,_std::default_delete<CFieldList>_>._M_t
           .super__Tuple_impl<0UL,_CFieldList_*,_std::default_delete<CFieldList>_>.
           super__Head_base<0UL,_CFieldList_*,_false>._M_head_impl;
  if (pCVar2 != (CFieldList *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_48,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  pCVar3 = (stm->statements)._M_t.
           super___uniq_ptr_impl<CCompoundStm,_std::default_delete<CCompoundStm>_>._M_t.
           super__Tuple_impl<0UL,_CCompoundStm_*,_std::default_delete<CCompoundStm>_>.
           super__Head_base<0UL,_CCompoundStm_*,_false>._M_head_impl;
  if (pCVar3 != (CCompoundStm *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar3->super_IStatement).super_PositionedNode)(pCVar3,this);
    TypeInfo::TypeInfo((TypeInfo *)local_48,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,(TypeInfo *)local_48);
    std::__cxx11::string::~string((string *)(local_48 + 8));
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMainMethod &stm )
{
	std::cout << "typechecker: mainmethod\n";
    currentMethod = currentClass->methods["main"];
    if( stm.vars ) {
        stm.vars->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
    if( stm.statements ) {
        stm.statements->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
}